

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.c
# Opt level: O0

int md5_test(void)

{
  uchar *in;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [11];
  undefined1 auVar4 [12];
  undefined1 auVar5 [13];
  undefined1 auVar6 [14];
  size_t inlen;
  long lVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  byte bVar23;
  undefined1 local_88 [8];
  hash_state md;
  uchar tmp [16];
  int local_10;
  int i;
  
  local_10 = 0;
  while( true ) {
    if (md5_test::tests[local_10].msg == (char *)0x0) {
      return 0;
    }
    md5_init((hash_state *)local_88);
    in = (uchar *)md5_test::tests[local_10].msg;
    inlen = strlen(md5_test::tests[local_10].msg);
    md5_process((hash_state *)local_88,in,inlen);
    md5_done((hash_state *)local_88,md.sha1.buf + 0x38);
    lVar7 = (long)local_10;
    cVar8 = -(md.sha1.buf[0x38] == md5_test::tests[lVar7].hash[0]);
    cVar9 = -(md.sha1.buf[0x39] == md5_test::tests[lVar7].hash[1]);
    cVar10 = -(md.sha1.buf[0x3a] == md5_test::tests[lVar7].hash[2]);
    cVar11 = -(md.sha1.buf[0x3b] == md5_test::tests[lVar7].hash[3]);
    cVar12 = -(md.sha1.buf[0x3c] == md5_test::tests[lVar7].hash[4]);
    cVar13 = -(md.sha1.buf[0x3d] == md5_test::tests[lVar7].hash[5]);
    cVar14 = -(md.sha1.buf[0x3e] == md5_test::tests[lVar7].hash[6]);
    cVar15 = -(md.sha1.buf[0x3f] == md5_test::tests[lVar7].hash[7]);
    cVar16 = -(tmp[0] == md5_test::tests[lVar7].hash[8]);
    cVar17 = -(tmp[1] == md5_test::tests[lVar7].hash[9]);
    cVar18 = -(tmp[2] == md5_test::tests[lVar7].hash[10]);
    cVar19 = -(tmp[3] == md5_test::tests[lVar7].hash[0xb]);
    cVar20 = -(tmp[4] == md5_test::tests[lVar7].hash[0xc]);
    cVar21 = -(tmp[5] == md5_test::tests[lVar7].hash[0xd]);
    cVar22 = -(tmp[6] == md5_test::tests[lVar7].hash[0xe]);
    bVar23 = -(tmp[7] == md5_test::tests[lVar7].hash[0xf]);
    auVar1[1] = cVar9;
    auVar1[0] = cVar8;
    auVar1[2] = cVar10;
    auVar1[3] = cVar11;
    auVar1[4] = cVar12;
    auVar1[5] = cVar13;
    auVar1[6] = cVar14;
    auVar1[7] = cVar15;
    auVar1[8] = cVar16;
    auVar1[9] = cVar17;
    auVar1[10] = cVar18;
    auVar1[0xb] = cVar19;
    auVar1[0xc] = cVar20;
    auVar1[0xd] = cVar21;
    auVar1[0xe] = cVar22;
    auVar1[0xf] = bVar23;
    auVar2[1] = cVar9;
    auVar2[0] = cVar8;
    auVar2[2] = cVar10;
    auVar2[3] = cVar11;
    auVar2[4] = cVar12;
    auVar2[5] = cVar13;
    auVar2[6] = cVar14;
    auVar2[7] = cVar15;
    auVar2[8] = cVar16;
    auVar2[9] = cVar17;
    auVar2[10] = cVar18;
    auVar2[0xb] = cVar19;
    auVar2[0xc] = cVar20;
    auVar2[0xd] = cVar21;
    auVar2[0xe] = cVar22;
    auVar2[0xf] = bVar23;
    auVar6[1] = cVar11;
    auVar6[0] = cVar10;
    auVar6[2] = cVar12;
    auVar6[3] = cVar13;
    auVar6[4] = cVar14;
    auVar6[5] = cVar15;
    auVar6[6] = cVar16;
    auVar6[7] = cVar17;
    auVar6[8] = cVar18;
    auVar6[9] = cVar19;
    auVar6[10] = cVar20;
    auVar6[0xb] = cVar21;
    auVar6[0xc] = cVar22;
    auVar6[0xd] = bVar23;
    auVar5[1] = cVar12;
    auVar5[0] = cVar11;
    auVar5[2] = cVar13;
    auVar5[3] = cVar14;
    auVar5[4] = cVar15;
    auVar5[5] = cVar16;
    auVar5[6] = cVar17;
    auVar5[7] = cVar18;
    auVar5[8] = cVar19;
    auVar5[9] = cVar20;
    auVar5[10] = cVar21;
    auVar5[0xb] = cVar22;
    auVar5[0xc] = bVar23;
    auVar4[1] = cVar13;
    auVar4[0] = cVar12;
    auVar4[2] = cVar14;
    auVar4[3] = cVar15;
    auVar4[4] = cVar16;
    auVar4[5] = cVar17;
    auVar4[6] = cVar18;
    auVar4[7] = cVar19;
    auVar4[8] = cVar20;
    auVar4[9] = cVar21;
    auVar4[10] = cVar22;
    auVar4[0xb] = bVar23;
    auVar3[1] = cVar14;
    auVar3[0] = cVar13;
    auVar3[2] = cVar15;
    auVar3[3] = cVar16;
    auVar3[4] = cVar17;
    auVar3[5] = cVar18;
    auVar3[6] = cVar19;
    auVar3[7] = cVar20;
    auVar3[8] = cVar21;
    auVar3[9] = cVar22;
    auVar3[10] = bVar23;
    if ((ushort)((ushort)(SUB161(auVar1 >> 7,0) & 1) | (ushort)(SUB161(auVar2 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB141(auVar6 >> 7,0) & 1) << 2 | (ushort)(SUB131(auVar5 >> 7,0) & 1) << 3
                 | (ushort)(SUB121(auVar4 >> 7,0) & 1) << 4 |
                 (ushort)(SUB111(auVar3 >> 7,0) & 1) << 5 |
                 (ushort)((byte)(CONCAT19(bVar23,CONCAT18(cVar22,CONCAT17(cVar21,CONCAT16(cVar20,
                                                  CONCAT15(cVar19,CONCAT14(cVar18,CONCAT13(cVar17,
                                                  CONCAT12(cVar16,CONCAT11(cVar15,cVar14))))))))) >>
                                7) & 1) << 6 |
                 (ushort)((byte)(CONCAT18(bVar23,CONCAT17(cVar22,CONCAT16(cVar21,CONCAT15(cVar20,
                                                  CONCAT14(cVar19,CONCAT13(cVar18,CONCAT12(cVar17,
                                                  CONCAT11(cVar16,cVar15)))))))) >> 7) & 1) << 7 |
                (ushort)(bVar23 >> 7) << 0xf) != 0xffff) break;
    local_10 = local_10 + 1;
  }
  return 5;
}

Assistant:

int  md5_test(void)
{
 #ifndef LTC_TEST
    return CRYPT_NOP;
 #else
  static const struct {
      char *msg;
      unsigned char hash[16];
  } tests[] = {
    { "",
      { 0xd4, 0x1d, 0x8c, 0xd9, 0x8f, 0x00, 0xb2, 0x04,
        0xe9, 0x80, 0x09, 0x98, 0xec, 0xf8, 0x42, 0x7e } },
    { "a",
      {0x0c, 0xc1, 0x75, 0xb9, 0xc0, 0xf1, 0xb6, 0xa8,
       0x31, 0xc3, 0x99, 0xe2, 0x69, 0x77, 0x26, 0x61 } },
    { "abc",
      { 0x90, 0x01, 0x50, 0x98, 0x3c, 0xd2, 0x4f, 0xb0,
        0xd6, 0x96, 0x3f, 0x7d, 0x28, 0xe1, 0x7f, 0x72 } },
    { "message digest",
      { 0xf9, 0x6b, 0x69, 0x7d, 0x7c, 0xb7, 0x93, 0x8d,
        0x52, 0x5a, 0x2f, 0x31, 0xaa, 0xf1, 0x61, 0xd0 } },
    { "abcdefghijklmnopqrstuvwxyz",
      { 0xc3, 0xfc, 0xd3, 0xd7, 0x61, 0x92, 0xe4, 0x00,
        0x7d, 0xfb, 0x49, 0x6c, 0xca, 0x67, 0xe1, 0x3b } },
    { "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789",
      { 0xd1, 0x74, 0xab, 0x98, 0xd2, 0x77, 0xd9, 0xf5,
        0xa5, 0x61, 0x1c, 0x2c, 0x9f, 0x41, 0x9d, 0x9f } },
    { "12345678901234567890123456789012345678901234567890123456789012345678901234567890",
      { 0x57, 0xed, 0xf4, 0xa2, 0x2b, 0xe3, 0xc9, 0x55,
        0xac, 0x49, 0xda, 0x2e, 0x21, 0x07, 0xb6, 0x7a } },
    { NULL, { 0 } }
  };

  int i;
  unsigned char tmp[16];
  hash_state md;

  for (i = 0; tests[i].msg != NULL; i++) {
      md5_init(&md);
      md5_process(&md, (unsigned char *)tests[i].msg, (unsigned long)strlen(tests[i].msg));
      md5_done(&md, tmp);
      if (XMEMCMP(tmp, tests[i].hash, 16) != 0) {
         return CRYPT_FAIL_TESTVECTOR;
      }
  }
  return CRYPT_OK;
 #endif
}